

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_filter.hpp
# Opt level: O3

void __thiscall
libtorrent::detail::filter_impl<unsigned_short>::filter_impl(filter_impl<unsigned_short> *this)

{
  _Rb_tree_header *p_Var1;
  ulong in_RAX;
  range local_18;
  
  p_Var1 = &(this->m_access_list)._M_t._M_impl.super__Rb_tree_header;
  (this->m_access_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_access_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_access_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_access_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_access_list)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_18 = (range)((in_RAX >> 0x10 & 0xffff) << 0x10);
  std::
  _Rb_tree<libtorrent::detail::filter_impl<unsigned_short>::range,_libtorrent::detail::filter_impl<unsigned_short>::range,_std::_Identity<libtorrent::detail::filter_impl<unsigned_short>::range>,_std::less<libtorrent::detail::filter_impl<unsigned_short>::range>,_std::allocator<libtorrent::detail::filter_impl<unsigned_short>::range>_>
  ::_M_insert_unique<libtorrent::detail::filter_impl<unsigned_short>::range>
            ((_Rb_tree<libtorrent::detail::filter_impl<unsigned_short>::range,_libtorrent::detail::filter_impl<unsigned_short>::range,_std::_Identity<libtorrent::detail::filter_impl<unsigned_short>::range>,_std::less<libtorrent::detail::filter_impl<unsigned_short>::range>,_std::allocator<libtorrent::detail::filter_impl<unsigned_short>::range>_>
              *)this,&local_18);
  return;
}

Assistant:

filter_impl()
		{
			// make the entire ip-range non-blocked
			m_access_list.insert(range(zero<Addr>(), 0));
		}